

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayleigh_dist.hpp
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,param_type *P)

{
  undefined4 uVar1;
  ostream *poVar2;
  char local_1a [2];
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = 0x26;
  local_1a[0] = '(';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(out,local_1a,1);
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 8) = 0x10;
  poVar2 = std::ostream::_M_insert<double>(P->nu_);
  local_1a[1] = 0x29;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_1a + 1,1);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
  return out;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
          std::basic_ostream<char_t, traits_t> &out, const param_type &P) {
        std::ios_base::fmtflags flags(out.flags());
        out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        out << '(' << std::setprecision(math::numeric_limits<float_t>::digits10 + 1) << P.nu()
            << ')';
        out.flags(flags);
        return out;
      }